

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O2

void __thiscall
RangeLock_MoveAssign_Test::~RangeLock_MoveAssign_Test(RangeLock_MoveAssign_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (RangeLock, MoveAssign) {
    mock_file file1;
    mock_file file2;

    using ::testing::_;
    using ::testing::Expectation;
    using ::testing::Return;

    Expectation file1_lock = EXPECT_CALL (file1, lock (UINT64_C (13),   // offset
                                                       std::size_t{17}, // size
                                                       mock_file::lock_kind::exclusive_write,
                                                       mock_file::blocking_mode::blocking))
                                 .WillOnce (Return (true));

    Expectation file2_lock = EXPECT_CALL (file2, lock (UINT64_C (19),   // offset
                                                       std::size_t{23}, // size
                                                       mock_file::lock_kind::shared_read,
                                                       mock_file::blocking_mode::blocking))
                                 .After (file1_lock)
                                 .WillOnce (Return (true));

    Expectation file2_unlock =
        EXPECT_CALL (file2, unlock (UINT64_C (19), std::size_t{23})).After (file2_lock);

    Expectation file1_unlock = EXPECT_CALL (file1, unlock (UINT64_C (13), std::size_t{17}))
                                   .Times (1)
                                   .After (file1_lock, file2_unlock);



    pstore::file::range_lock source_lock (&file1,
                                          UINT64_C (13),   // offset
                                          std::size_t{17}, // size
                                          mock_file::lock_kind::exclusive_write);
    pstore::file::range_lock target_lock (&file2,
                                          UINT64_C (19),   // offset
                                          std::size_t{23}, // size
                                          mock_file::lock_kind::shared_read);

    // Lock both the source and target of the assignment, just to be tricky.
    source_lock.lock ();
    target_lock.lock ();
    target_lock = std::move (source_lock);

// Clang SA (correctly) warns that this is (strictly) undefined behavior. However, the
// moved-from type is defined here and so is its behaviour that I would like to test.
#ifndef __clang_analyzer__
    // Check that lock1 was "destroyed" by the move
    EXPECT_EQ (nullptr, source_lock.file ())
        << "The file associated with the source of a move assignment should be null";
    EXPECT_FALSE (source_lock.is_locked ())
        << "The source of a move assignment should not be locked";
#endif

    // Check that lock2 matches the state of lock1 before the move
    EXPECT_EQ (&file1, target_lock.file ())
        << "The file associated with the target of the move is wrong";
    EXPECT_EQ (UINT64_C (13), target_lock.offset ())
        << "The offset of the move target range_lock is wrong";
    EXPECT_EQ (std::size_t{17}, target_lock.size ())
        << "The size of the move target range_lock is wrong";
    EXPECT_EQ (mock_file::lock_kind::exclusive_write, target_lock.kind ());
    EXPECT_TRUE (target_lock.is_locked ())
        << "Expected the target of the move operation to be locked";

    target_lock.unlock ();
}